

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

bool __thiscall soplex::SPxSolverBase<double>::performSolutionPolishing(SPxSolverBase<double> *this)

{
  ClassSet<soplex::SVSetBase<double>::DLPSV> *this_00;
  uint n;
  uint n_00;
  int iVar1;
  Status *pSVar2;
  Status *pSVar3;
  SPxOut *pSVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  Status SVar8;
  int iVar9;
  long lVar10;
  Status **ppSVar11;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *this_01;
  ulong uVar12;
  int iVar13;
  int i;
  double extraout_XMM0_Qa;
  Real RVar14;
  double extraout_XMM0_Qa_00;
  double dVar15;
  SPxId polishId;
  Verbosity old_verbosity;
  DIdxSet continuousvars;
  DataKey local_d0;
  DIdxSet local_c8;
  Status **local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  DIdxSet local_80;
  double local_60;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *local_58;
  Status **local_50;
  double local_48;
  
  if (((-1 < this->maxIters) && (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) &&
     (bVar6 = isTimeLimitReached(this,false), !bVar6)) {
    return false;
  }
  if ((this->polishObj == POLISH_OFF) || (SVar8 = status(this), SVar8 != OPTIMAL)) {
    bVar6 = false;
  }
  else {
    pSVar2 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    pSVar3 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    local_d0.info = 0;
    local_d0.idx = -1;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this);
    pSVar4 = this->spxout;
    local_48 = extraout_XMM0_Qa;
    if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
      local_80.super_IdxSet._vptr_IdxSet._0_4_ = 4;
      local_c8.super_IdxSet._vptr_IdxSet._0_4_ = pSVar4->m_verbosity;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar4->m_streams[pSVar4->m_verbosity]," --- perform solution polishing",0x1f);
      cVar5 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18)
                      + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_c8);
    }
    if (this->theRep == COLUMN) {
      setType(this,ENTER);
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])(this);
      local_60 = entertol(this);
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum;
        n_00 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum;
        DIdxSet::DIdxSet(&local_c8,n);
        DIdxSet::DIdxSet(&local_80,n_00);
        if (0 < (int)n) {
          uVar12 = 0;
          do {
            if ((pSVar2[uVar12] | D_ON_UPPER) == P_ON_UPPER) {
              local_a8 = (Status **)
                         (this->theCoPvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12];
              uStack_a0 = 0;
              RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              dVar15 = ABS((double)local_a8);
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (dVar15 <= 1.0) {
                dVar15 = 1.0;
              }
              if (ABS((double)local_a8 / dVar15) <= RVar14) {
                DIdxSet::addIdx(&local_c8,(int)uVar12);
              }
            }
            uVar12 = uVar12 + 1;
          } while (n != uVar12);
        }
        if (0 < (int)n_00 && (this->integerVariables).thesize == n_00) {
          uVar12 = 0;
          do {
            if ((pSVar3[uVar12] | D_ON_UPPER) == P_ON_UPPER) {
              local_a8 = (Status **)
                         (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12];
              uStack_a0 = 0;
              local_98 = (this->thePvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12];
              RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              dVar15 = ABS((double)local_a8 - local_98);
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (dVar15 <= 1.0) {
                dVar15 = 1.0;
              }
              if ((ABS(((double)local_a8 - local_98) / dVar15) <= RVar14) &&
                 ((this->integerVariables).data[uVar12] == 0)) {
                DIdxSet::addIdx(&local_80,(int)uVar12);
              }
            }
            uVar12 = uVar12 + 1;
          } while (n_00 != uVar12);
        }
        bVar6 = false;
        do {
          uVar12 = (ulong)local_c8.super_IdxSet.num;
          if (((long)uVar12 < 1) || (bVar6)) {
            iVar13 = 0;
          }
          else {
            iVar13 = 0;
            do {
              local_d0 = (DataKey)coId(this,local_c8.super_IdxSet.idx[uVar12 - 1]);
              bVar7 = enter(this,(SPxId *)&local_d0,true);
              (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
              if (bVar7) {
                iVar13 = iVar13 + 1;
                lVar10 = (long)local_c8.super_IdxSet.num;
                local_c8.super_IdxSet.num = local_c8.super_IdxSet.num + -1;
                local_c8.super_IdxSet.idx[uVar12 - 1] = local_c8.super_IdxSet.idx[lVar10 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                  bVar6 = true;
                }
              }
              bVar7 = isTimeLimitReached(this,false);
              if (bVar7) {
                bVar6 = true;
              }
            } while ((1 < uVar12) && (uVar12 = uVar12 - 1, !bVar6));
          }
          uVar12 = (ulong)local_80.super_IdxSet.num;
          if (0 < (long)uVar12) {
            while (!bVar6) {
              local_d0 = (DataKey)id(this,local_80.super_IdxSet.idx[uVar12 - 1]);
              bVar7 = enter(this,(SPxId *)&local_d0,true);
              (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
              if (bVar7) {
                iVar13 = iVar13 + 1;
                lVar10 = (long)local_80.super_IdxSet.num;
                local_80.super_IdxSet.num = local_80.super_IdxSet.num + -1;
                local_80.super_IdxSet.idx[uVar12 - 1] = local_80.super_IdxSet.idx[lVar10 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                  bVar6 = true;
                }
              }
              bVar7 = isTimeLimitReached(this,false);
              if (bVar7) {
                bVar6 = true;
              }
              if (uVar12 < 2) break;
              uVar12 = uVar12 - 1;
            }
          }
          if (iVar13 == 0) {
            bVar6 = true;
          }
          this->polishCount = this->polishCount + iVar13;
        } while (!bVar6);
        DIdxSet::~DIdxSet(&local_80);
      }
      else {
        DIdxSet::DIdxSet(&local_c8,(this->thecovectors->set).thenum);
        if (0 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                set.thenum) {
          lVar10 = 0;
          do {
            if ((pSVar3[lVar10] | D_ON_UPPER) == P_ON_UPPER) {
              local_a8 = (Status **)
                         (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10];
              uStack_a0 = 0;
              local_98 = (this->thePvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10];
              RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              dVar15 = ABS((double)local_a8 - local_98);
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (dVar15 <= 1.0) {
                dVar15 = 1.0;
              }
              if (ABS(((double)local_a8 - local_98) / dVar15) <= RVar14) {
                DIdxSet::addIdx(&local_c8,(int)lVar10);
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                            super_SVSetBase<double>.set.thenum);
        }
        bVar6 = false;
        while ((uVar12 = (ulong)local_c8.super_IdxSet.num, 0 < (long)uVar12 && (!bVar6))) {
          iVar13 = 0;
          do {
            local_d0 = (DataKey)id(this,local_c8.super_IdxSet.idx[uVar12 - 1]);
            bVar7 = enter(this,(SPxId *)&local_d0,true);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
            if (bVar7) {
              iVar13 = iVar13 + 1;
              lVar10 = (long)local_c8.super_IdxSet.num;
              local_c8.super_IdxSet.num = local_c8.super_IdxSet.num + -1;
              local_c8.super_IdxSet.idx[uVar12 - 1] = local_c8.super_IdxSet.idx[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                bVar6 = true;
              }
            }
            bVar7 = isTimeLimitReached(this,false);
            if (bVar7) {
              bVar6 = true;
            }
          } while ((1 < uVar12) && (uVar12 = uVar12 - 1, !bVar6));
          if ((iVar13 == 0) || (this->polishCount = this->polishCount + iVar13, bVar6)) break;
        }
      }
    }
    else {
      local_a8 = &(this->super_SPxBasisBase<double>).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])(this);
      local_60 = leavetol(this);
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      iVar13 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum;
      iVar1 = (this->integerVariables).thesize;
      if (this->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(&local_c8,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_50 = &(this->super_SPxBasisBase<double>).thedesc.rowstat.data;
          local_58 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set;
          this_00 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set;
          lVar10 = 0;
          do {
            local_d0 = (this->super_SPxBasisBase<double>).theBaseId.data[lVar10].super_DataKey;
            if (local_d0.info < 0) {
              iVar9 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number(this_00,&local_d0);
              ppSVar11 = local_50;
LAB_001d18b1:
              if (((*ppSVar11)[iVar9] & (P_ON_LOWER|D_FREE)) == P_ON_LOWER) {
                local_98 = (this->theFvec->super_VectorBase<double>).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar10];
                uStack_90 = 0;
                RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                dVar15 = ABS(local_98);
                if (dVar15 <= 0.0) {
                  dVar15 = 0.0;
                }
                if (dVar15 <= 1.0) {
                  dVar15 = 1.0;
                }
                if (ABS(local_98 / dVar15) <= RVar14) {
                  DIdxSet::addIdx(&local_c8,(int)lVar10);
                }
              }
            }
            else if (iVar1 == iVar13) {
              SPxColId::SPxColId((SPxColId *)&local_80,(SPxId *)&local_d0);
              iVar9 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                                (local_58,(DataKey *)&local_80);
              if ((this->integerVariables).data[iVar9] != 1) {
                this_01 = this_00;
                if (0 < local_d0.info) {
                  this_01 = local_58;
                }
                iVar9 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number(this_01,&local_d0);
                ppSVar11 = local_a8;
                goto LAB_001d18b1;
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (this->thecovectors->set).thenum);
        }
        bVar6 = false;
        while ((uVar12 = (ulong)local_c8.super_IdxSet.num, 0 < (long)uVar12 && (!bVar6))) {
          iVar13 = 0;
          do {
            bVar7 = leave(this,local_c8.super_IdxSet.idx[uVar12 - 1],true);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
            if (bVar7) {
              iVar13 = iVar13 + 1;
              lVar10 = (long)local_c8.super_IdxSet.num;
              local_c8.super_IdxSet.num = local_c8.super_IdxSet.num + -1;
              local_c8.super_IdxSet.idx[uVar12 - 1] = local_c8.super_IdxSet.idx[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                bVar6 = true;
              }
            }
            bVar7 = isTimeLimitReached(this,false);
            if (bVar7) {
              bVar6 = true;
            }
          } while ((1 < uVar12) && (uVar12 = uVar12 - 1, !bVar6));
          if ((iVar13 == 0) || (this->polishCount = this->polishCount + iVar13, bVar6)) break;
        }
      }
      else {
        DIdxSet::DIdxSet(&local_c8,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          lVar10 = 0;
          do {
            local_d0 = (this->super_SPxBasisBase<double>).theBaseId.data[lVar10].super_DataKey;
            if (-1 < local_d0.info) {
              if (iVar1 == iVar13) {
                SPxColId::SPxColId((SPxColId *)&local_80,(SPxId *)&local_d0);
                iVar9 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                                  (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                                    super_SVSetBase<double>.set,(DataKey *)&local_80);
                if ((this->integerVariables).data[iVar9] == 0) goto LAB_001d1c92;
              }
              if (((*local_a8)[lVar10] & (P_ON_LOWER|D_FREE)) == P_ON_LOWER) {
                local_98 = (this->theFvec->super_VectorBase<double>).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar10];
                uStack_90 = 0;
                RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                dVar15 = ABS(local_98);
                if (dVar15 <= 0.0) {
                  dVar15 = 0.0;
                }
                if (dVar15 <= 1.0) {
                  dVar15 = 1.0;
                }
                if (ABS(local_98 / dVar15) <= RVar14) {
                  DIdxSet::addIdx(&local_c8,(int)lVar10);
                }
              }
            }
LAB_001d1c92:
            lVar10 = lVar10 + 1;
          } while (lVar10 < (this->thecovectors->set).thenum);
        }
        bVar6 = false;
        while ((uVar12 = (ulong)local_c8.super_IdxSet.num, 0 < (long)uVar12 && (!bVar6))) {
          iVar13 = 0;
          do {
            bVar7 = leave(this,local_c8.super_IdxSet.idx[uVar12 - 1],true);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
            if (bVar7) {
              iVar13 = iVar13 + 1;
              lVar10 = (long)local_c8.super_IdxSet.num;
              local_c8.super_IdxSet.num = local_c8.super_IdxSet.num + -1;
              local_c8.super_IdxSet.idx[uVar12 - 1] = local_c8.super_IdxSet.idx[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                bVar6 = true;
              }
            }
            bVar7 = isTimeLimitReached(this,false);
            if (bVar7) {
              bVar6 = true;
            }
          } while ((1 < uVar12) && (uVar12 = uVar12 - 1, !bVar6));
          if ((iVar13 == 0) || (this->polishCount = this->polishCount + iVar13, bVar6)) break;
        }
      }
    }
    DIdxSet::~DIdxSet(&local_c8);
    pSVar4 = this->spxout;
    if ((pSVar4 != (SPxOut *)0x0) && (2 < (int)pSVar4->m_verbosity)) {
      local_80.super_IdxSet._vptr_IdxSet._0_4_ = 3;
      local_c8.super_IdxSet._vptr_IdxSet._0_4_ = pSVar4->m_verbosity;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar4->m_streams[pSVar4->m_verbosity]," --- finished solution polishing (",0x22);
      std::ostream::operator<<((ostream *)pSVar4->m_streams[pSVar4->m_verbosity],this->polishCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar4->m_streams[pSVar4->m_verbosity]," pivots)",8);
      cVar5 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18)
                      + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_c8);
    }
    if ((this->super_SPxBasisBase<double>).thestatus != OPTIMAL) {
      (this->super_SPxBasisBase<double>).thestatus = OPTIMAL;
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this);
    dVar15 = ABS(extraout_XMM0_Qa_00);
    if (ABS(extraout_XMM0_Qa_00) <= ABS(local_48)) {
      dVar15 = ABS(local_48);
    }
    if (dVar15 <= 1.0) {
      dVar15 = 1.0;
    }
    bVar6 = local_60 < ABS((extraout_XMM0_Qa_00 - local_48) / dVar15);
  }
  return bVar6;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}